

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_view_box(element_t *element,int id,plutovg_rect_t *view_box)

{
  _Bool _Var1;
  attribute *paVar2;
  string_t *psVar3;
  char *it_1;
  byte *pbVar4;
  undefined4 in_register_00000034;
  float *pfVar5;
  byte *end;
  bool bVar6;
  char *it;
  float h;
  float w;
  float y;
  float x;
  byte *local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  pfVar5 = (float *)CONCAT44(in_register_00000034,id);
  for (paVar2 = element->attributes; paVar2 != (attribute *)0x0; paVar2 = paVar2->next) {
    if (paVar2->id == 0x27) {
      psVar3 = &paVar2->value;
      goto LAB_00104b52;
    }
  }
  psVar3 = (string_t *)0x0;
LAB_00104b52:
  if (psVar3 != (string_t *)0x0) {
    local_28 = (byte *)psVar3->data;
    end = local_28 + psVar3->length;
    _Var1 = parse_float((char **)&local_28,(char *)end,&local_14);
    if (_Var1) {
      bVar6 = local_28 < end;
      pbVar4 = local_28;
      if (bVar6) {
        if (0x2c < (ulong)*local_28) {
          return false;
        }
        if ((0x100100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0) {
          return false;
        }
        bVar6 = true;
        do {
          pbVar4 = local_28;
          if ((0x20 < (ulong)*local_28) || ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0))
          break;
          local_28 = local_28 + 1;
          bVar6 = local_28 < end;
          pbVar4 = end;
        } while (local_28 != end);
      }
      local_28 = pbVar4;
      if (bVar6) {
        bVar6 = false;
        if (pbVar4 < end) {
          bVar6 = *pbVar4 == 0x2c;
          pbVar4 = pbVar4 + bVar6;
        }
        local_28 = pbVar4;
        if ((bVar6) && (pbVar4 < end)) {
          while (local_28 = pbVar4, (ulong)*pbVar4 < 0x21) {
            if (((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0) ||
               (pbVar4 = pbVar4 + 1, local_28 = end, pbVar4 == end)) break;
          }
        }
      }
      if ((local_28 < end) && (_Var1 = parse_float((char **)&local_28,(char *)end,&local_18), _Var1)
         ) {
        bVar6 = local_28 < end;
        pbVar4 = local_28;
        if (bVar6) {
          if (0x2c < (ulong)*local_28) {
            return false;
          }
          if ((0x100100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0) {
            return false;
          }
          bVar6 = true;
          do {
            pbVar4 = local_28;
            if ((0x20 < (ulong)*local_28) || ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0))
            break;
            local_28 = local_28 + 1;
            bVar6 = local_28 < end;
            pbVar4 = end;
          } while (local_28 != end);
        }
        local_28 = pbVar4;
        if (bVar6) {
          bVar6 = false;
          if (pbVar4 < end) {
            bVar6 = *pbVar4 == 0x2c;
            pbVar4 = pbVar4 + bVar6;
          }
          local_28 = pbVar4;
          if ((bVar6) && (pbVar4 < end)) {
            while (local_28 = pbVar4, (ulong)*pbVar4 < 0x21) {
              if (((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0) ||
                 (pbVar4 = pbVar4 + 1, local_28 = end, pbVar4 == end)) break;
            }
          }
        }
        if ((local_28 < end) &&
           (((_Var1 = parse_float((char **)&local_28,(char *)end,&local_1c), _Var1 &&
             (_Var1 = skip_ws_comma((char **)&local_28,(char *)end), _Var1)) &&
            (_Var1 = parse_float((char **)&local_28,(char *)end,&local_20), _Var1)))) {
          bVar6 = local_28 < end;
          if (bVar6) {
            bVar6 = true;
            do {
              if ((0x20 < (ulong)*local_28) ||
                 ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0)) break;
              local_28 = local_28 + 1;
              bVar6 = local_28 < end;
            } while (local_28 != end);
          }
          if (!bVar6) {
            if (local_1c <= 0.0) {
              return false;
            }
            if (local_20 <= 0.0) {
              return false;
            }
            *pfVar5 = local_14;
            pfVar5[1] = local_18;
            pfVar5[2] = local_1c;
            pfVar5[3] = local_20;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool parse_view_box(const element_t* element, int id, plutovg_rect_t* view_box)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;

    float x, y, w, h;
    if(!parse_float(&it, end, &x)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &y)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &w)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &h)
        || skip_ws(&it, end)) {
        return false;
    }

    if(w <= 0.f || h <= 0.f)
        return false;
    view_box->x = x;
    view_box->y = y;
    view_box->w = w;
    view_box->h = h;
    return true;
}